

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_embed_optimize_for.pb.cc
# Opt level: O1

void proto2_unittest::TestEmbedOptimizedForSize::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Message *from;
  ulong uVar2;
  _func_int **pp_Var3;
  Nonnull<const_char_*> pcVar4;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::TestOptimizedForSize>);
    }
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      from = (Message *)from_msg[3]._vptr_MessageLite;
      if (from == (Message *)0x0) {
        MergeImpl((TestEmbedOptimizedForSize *)&stack0xffffffffffffffd0);
        goto LAB_00cfb8e1;
      }
      if ((Message *)to_msg[3]._vptr_MessageLite == (Message *)0x0) {
        pp_Var3 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest::TestOptimizedForSize>
                            (arena,from);
        to_msg[3]._vptr_MessageLite = pp_Var3;
      }
      else {
        google::protobuf::Message::MergeFrom((Message *)to_msg[3]._vptr_MessageLite,from);
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00cfb8e1:
  MergeImpl();
}

Assistant:

void TestEmbedOptimizedForSize::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEmbedOptimizedForSize*>(&to_msg);
  auto& from = static_cast<const TestEmbedOptimizedForSize&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestEmbedOptimizedForSize)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_message()->MergeFrom(
      from._internal_repeated_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(from._impl_.optional_message_ != nullptr);
    if (_this->_impl_.optional_message_ == nullptr) {
      _this->_impl_.optional_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_message_);
    } else {
      _this->_impl_.optional_message_->MergeFrom(*from._impl_.optional_message_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}